

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O0

Float pbrt::IntegrateCatmullRom(span<const_float> x,span<const_float> values,span<float> cdf)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  char (*args_2) [9];
  char (*pacVar4) [9];
  float *pfVar5;
  ulong uVar6;
  size_t sVar7;
  float *in_RDX;
  float *in_R8;
  char (*in_R9) [14];
  float fVar8;
  float fVar9;
  Float d1;
  Float d0;
  Float width;
  Float f1;
  Float f0;
  Float x1;
  Float x0;
  int i;
  Float sum;
  size_t vb;
  size_t va;
  char (*in_stack_ffffffffffffff88) [14];
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  float fVar10;
  float fVar11;
  int in_stack_ffffffffffffffa4;
  float fVar12;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int local_50;
  LogLevel in_stack_ffffffffffffffb4;
  float fVar13;
  span<const_float> local_18;
  
  args_2 = (char (*) [9])pstd::span<const_float>::size(&local_18);
  pacVar4 = (char (*) [9])
            pstd::span<const_float>::size((span<const_float> *)&stack0xffffffffffffffd8);
  if (args_2 != pacVar4) {
    LogFatal<char_const(&)[9],char_const(&)[14],char_const(&)[9],unsigned_long&,char_const(&)[14],unsigned_long&>
              (in_stack_ffffffffffffffb4,
               (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               in_stack_ffffffffffffffa4,
               (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
               (char (*) [9])CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88,args_2,(unsigned_long *)in_R8,in_R9,(unsigned_long *)in_RDX
              );
  }
  fVar13 = 0.0;
  pfVar5 = pstd::span<float>::operator[]((span<float> *)&stack0xffffffffffffffc8,0);
  *pfVar5 = 0.0;
  local_50 = 0;
  while( true ) {
    uVar6 = (ulong)local_50;
    sVar7 = pstd::span<const_float>::size(&local_18);
    if (sVar7 - 1 <= uVar6) break;
    pfVar5 = pstd::span<const_float>::operator[](&local_18,(long)local_50);
    fVar9 = *pfVar5;
    pfVar5 = pstd::span<const_float>::operator[](&local_18,(long)(local_50 + 1));
    fVar8 = *pfVar5;
    pfVar5 = pstd::span<const_float>::operator[]
                       ((span<const_float> *)&stack0xffffffffffffffd8,(long)local_50);
    fVar12 = *pfVar5;
    pfVar5 = pstd::span<const_float>::operator[]
                       ((span<const_float> *)&stack0xffffffffffffffd8,(long)(local_50 + 1));
    fVar1 = *pfVar5;
    fVar11 = fVar8 - fVar9;
    if (local_50 < 1) {
      fVar8 = fVar1 - fVar12;
    }
    else {
      fVar10 = fVar11;
      pfVar5 = pstd::span<const_float>::operator[]
                         ((span<const_float> *)&stack0xffffffffffffffd8,(long)(local_50 + -1));
      fVar2 = *pfVar5;
      pfVar5 = pstd::span<const_float>::operator[](&local_18,(long)(local_50 + -1));
      fVar8 = (fVar11 * (fVar1 - fVar2)) / (fVar8 - *pfVar5);
      fVar11 = fVar10;
    }
    sVar7 = pstd::span<const_float>::size(&local_18);
    if ((ulong)(long)(local_50 + 2) < sVar7) {
      fVar10 = fVar11;
      pfVar5 = pstd::span<const_float>::operator[]
                         ((span<const_float> *)&stack0xffffffffffffffd8,(long)(local_50 + 2));
      fVar2 = *pfVar5 - fVar12;
      pfVar5 = pstd::span<const_float>::operator[](&local_18,(long)(local_50 + 2));
      fVar9 = (fVar11 * fVar2) / (*pfVar5 - fVar9);
      fVar11 = fVar10;
    }
    else {
      fVar9 = fVar1 - fVar12;
    }
    auVar3 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3daaaaab),0),ZEXT416((uint)(fVar8 - fVar9)),
                             ZEXT416((uint)((fVar12 + fVar1) * 0.5)));
    auVar3 = vfmadd213ss_fma(ZEXT416((uint)fVar11),auVar3,ZEXT416((uint)fVar13));
    fVar13 = auVar3._0_4_;
    pfVar5 = pstd::span<float>::operator[]
                       ((span<float> *)&stack0xffffffffffffffc8,(long)(local_50 + 1));
    *pfVar5 = auVar3._0_4_;
    local_50 = local_50 + 1;
  }
  return fVar13;
}

Assistant:

Float IntegrateCatmullRom(pstd::span<const Float> x, pstd::span<const Float> values,
                          pstd::span<Float> cdf) {
    CHECK_EQ(x.size(), values.size());
    Float sum = 0;
    cdf[0] = 0;
    for (int i = 0; i < x.size() - 1; ++i) {
        // Look up $x_i$ and function values of spline segment _i_
        Float x0 = x[i], x1 = x[i + 1];
        Float f0 = values[i], f1 = values[i + 1];
        Float width = x1 - x0;

        // Approximate derivatives using finite differences
        Float d0, d1;
        if (i > 0)
            d0 = width * (f1 - values[i - 1]) / (x1 - x[i - 1]);
        else
            d0 = f1 - f0;
        if (i + 2 < x.size())
            d1 = width * (values[i + 2] - f0) / (x[i + 2] - x0);
        else
            d1 = f1 - f0;

        // Keep a running sum and build a cumulative distribution function
        sum += ((d0 - d1) * (1.f / 12.f) + (f0 + f1) * .5f) * width;
        cdf[i + 1] = sum;
    }
    return sum;
}